

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O2

void __thiscall
wabt::OpcodeInfo::OpcodeInfo<unsigned_int>
          (OpcodeInfo *this,Opcode opcode,Kind kind,uint *data,size_t count,uint extra)

{
  OpcodeInfo<unsigned_int>(this,opcode,kind,data,count);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->data_,
             (size_type_conflict)
             ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
             (4 - (long)(this->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start)));
  *(uint *)((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish + -4) = extra;
  return;
}

Assistant:

OpcodeInfo::OpcodeInfo(Opcode opcode, Kind kind, T* data, size_t count, T extra)
    : OpcodeInfo(opcode, kind, data, count) {
  data_.resize(data_.size() + sizeof(T));
  memcpy(data_.data() + data_.size() - sizeof(T), &extra, sizeof(T));
}